

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_Constractor1_Test::TestBody(ConfidentialTxIn_Constractor1_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  _func_int *p_Var4;
  char *pcVar5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_5;
  ConfidentialTxIn txin2;
  ConfidentialTxIn txin1;
  undefined1 local_368 [32];
  undefined1 local_348 [56];
  string local_310;
  internal local_2f0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  ConfidentialTxIn local_2e0;
  ConfidentialTxIn local_180;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_180,&exp_txid,2,0xfffffffe);
  local_348._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_180.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_2e0,"txin1.GetVout()","exp_index",(uint *)local_348,&exp_index);
  if ((char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)local_348);
    if (local_2e0.super_AbstractTxIn.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var4 = (_func_int *)0x5a7bf1;
    }
    else {
      p_Var4 = *local_2e0.super_AbstractTxIn.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x47,(char *)p_Var4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((AssertHelperData *)local_348._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_348._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2e0.super_AbstractTxIn.txid_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::AbstractTxIn::GetSequence(&local_180.super_AbstractTxIn);
  local_348._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_2e0,"txin1.GetSequence()","exp_sequence",(uint *)local_348,
             &exp_sequence);
  if ((char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)local_348);
    if (local_2e0.super_AbstractTxIn.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var4 = (_func_int *)0x5a7bf1;
    }
    else {
      p_Var4 = *local_2e0.super_AbstractTxIn.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x48,(char *)p_Var4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((AssertHelperData *)local_348._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_348._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_2e0.super_AbstractTxIn.txid_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_348,&local_180.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_2e0,(Txid *)local_348);
  pcVar5 = (char *)CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                            (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_368,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_310,"txin1.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar5,(char *)local_368._0_8_);
  if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)(local_368 + 0x10)) {
    operator_delete((void *)local_368._0_8_);
  }
  if ((ByteData *)
      CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
               (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn) !=
      &local_2e0.super_AbstractTxIn.txid_.data_) {
    operator_delete((undefined1 *)
                    CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                             (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn));
  }
  local_348._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_348._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_348._8_8_);
  }
  if ((char)local_310._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    if ((undefined8 *)local_310._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_310._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x49,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                 (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                           (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_2e0.super_AbstractTxIn._vptr_AbstractTxIn._1_7_,
                                       (char)local_2e0.super_AbstractTxIn._vptr_AbstractTxIn) + 8))
                  ();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_310._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_2e0,&exp_txid,2,0xfffffffe,&exp_script);
  local_368._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_2e0.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_348,"txin2.GetVout()","exp_index",(uint *)local_368,&exp_index);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_368);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
    if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_368._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_348 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar3 = cfd::core::AbstractTxIn::GetSequence(&local_2e0.super_AbstractTxIn);
  local_368._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_348,"txin2.GetSequence()","exp_sequence",(uint *)local_368,
             &exp_sequence);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_368);
    if ((pointer)local_348._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
    if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_368._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_348 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_368,&local_2e0.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_348,(Txid *)local_368);
  uVar1 = local_348._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_(&local_310,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_2f0,"txin2.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",(char *)uVar1,
             (char *)CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p) !=
      &local_310.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p));
  }
  if ((AssertHelperData *)local_348._0_8_ != (AssertHelperData *)(local_348 + 0x10)) {
    operator_delete((void *)local_348._0_8_);
  }
  local_368._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_368._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_368._8_8_);
  }
  if (local_2f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if (local_2e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_2e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x4e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((AssertHelperData *)local_348._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_348._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)local_348,&local_2e0.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_368,(Script *)local_348);
  uVar1 = local_368._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_(&local_310,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_2f0,"txin2.GetUnlockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)uVar1,
             (char *)CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p) !=
      &local_310.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_310._M_dataplus._M_p._1_7_,(char)local_310._M_dataplus._M_p));
  }
  if ((AssertHelperData *)local_368._0_8_ != (AssertHelperData *)(local_368 + 0x10)) {
    operator_delete((void *)local_368._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_348);
  if (local_2f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_348);
    if (local_2e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_2e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x50,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_348._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_348._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_2e0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_180);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor1) {
  ConfidentialTxIn txin1(exp_txid, exp_index, exp_sequence);
  EXPECT_EQ(txin1.GetVout(), exp_index);
  EXPECT_EQ(txin1.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin1.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());

  ConfidentialTxIn txin2(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_EQ(txin2.GetVout(), exp_index);
  EXPECT_EQ(txin2.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin2.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin2.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
}